

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int unixOpen(sqlite3_vfs *pVfs,char *zPath,sqlite3_file *pFile,int flags,int *pOutFlags)

{
  byte *pbVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  dev_t dVar5;
  _func_int_sqlite3_file_ptr *p_Var6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  sqlite3_io_methods *psVar10;
  uint *puVar11;
  unixInodeInfo *puVar12;
  UnixUnusedFd **ppUVar13;
  size_t sVar14;
  sqlite3_mutex *psVar15;
  int *piVar16;
  sqlite3_io_methods *psVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  sqlite3_io_methods *psVar21;
  uint uVar22;
  mode_t m;
  long lVar23;
  size_t sVar24;
  char *pcVar25;
  int iVar26;
  undefined1 auVar27 [16];
  char zDb [513];
  char zTmpname [514];
  uint local_510;
  uint local_50c;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  uint local_4c0;
  uint local_4bc;
  uint local_4b8;
  undefined1 uStack_449;
  dev_t local_448;
  _func_int_sqlite3_file_ptr *p_Stack_440;
  char local_238 [520];
  
  uVar8 = flags & 0xffffff00;
  uVar18 = flags & 8;
  uVar19 = flags & 1;
  uVar22 = flags & 4;
  pcVar25 = zPath;
  if ((uVar22 == 0) || (((uVar8 != 0x800 && (uVar8 != 0x80000)) && (uVar8 != 0x4000)))) {
    *(undefined1 (*) [16])(pFile + 0xc) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(pFile + 10) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(pFile + 8) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(pFile + 6) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(pFile + 4) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(pFile + 2) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])pFile = (undefined1  [16])0x0;
    if (uVar8 == 0x100) {
      iVar9 = (*aSyscall[4].pCurrent)(zPath,&local_448);
      if (iVar9 == 0) {
        if ((sqlite3Config.bCoreMutex != 0) &&
           (psVar15 = (*sqlite3Config.mutex.xMutexAlloc)(2), psVar15 != (sqlite3_mutex *)0x0)) {
          (*sqlite3Config.mutex.xMutexEnter)(psVar15);
        }
        if (inodeList == (unixInodeInfo *)0x0) {
LAB_0014971b:
          psVar10 = (sqlite3_io_methods *)0x0;
        }
        else {
          psVar10 = (sqlite3_io_methods *)0x0;
          puVar12 = inodeList;
          do {
            if (((puVar12->fileId).dev == local_448) &&
               ((_func_int_sqlite3_file_ptr *)(puVar12->fileId).ino == p_Stack_440)) {
              psVar10 = (sqlite3_io_methods *)puVar12->pUnused;
              if (psVar10 == (sqlite3_io_methods *)0x0) goto LAB_0014971b;
              if (*(int *)&psVar10->field_0x4 != flags) goto LAB_001496fc;
              ppUVar13 = &puVar12->pUnused;
              goto LAB_00149712;
            }
            puVar12 = puVar12->pNext;
          } while (puVar12 != (unixInodeInfo *)0x0);
        }
        goto LAB_0014971e;
      }
      goto LAB_001493ed;
    }
    bVar3 = false;
  }
  else {
    *(undefined1 (*) [16])(pFile + 0xc) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(pFile + 10) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(pFile + 8) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(pFile + 6) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(pFile + 4) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(pFile + 2) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])pFile = (undefined1  [16])0x0;
    bVar3 = true;
  }
  if (zPath == (char *)0x0) {
    pcVar25 = local_238;
    iVar9 = unixGetTempname(0x202,pcVar25);
    if (iVar9 != 0) {
      return 1;
    }
  }
  iVar9 = uVar22 * 0x10 + 0x20080;
  if ((flags & 0x10U) == 0) {
    iVar9 = uVar22 * 0x10;
  }
  bVar7 = false;
LAB_00149492:
  bVar2 = bVar7;
  uVar22 = iVar9 + (flags & 2U);
  uVar20 = flags & 0x80800;
  if (uVar20 == 0) {
    m = 0x180;
    if (uVar18 == 0) {
      m = 0;
    }
    local_50c = 0;
    local_510 = 0;
  }
  else {
    if (pcVar25 == (char *)0x0) {
      sVar14 = 0;
    }
    else {
      lVar23 = -1;
      do {
        lVar4 = lVar23 + 1;
        lVar23 = lVar23 + 1;
      } while (pcVar25[lVar4] != '\0');
      sVar14 = (ulong)((uint)lVar23 & 0x3fffffff);
    }
    do {
      sVar24 = sVar14;
      sVar14 = sVar24 - 1;
    } while (pcVar25[sVar24 - 1] != '-');
    memcpy(&local_448,pcVar25,sVar24 - 1);
    (&uStack_449)[sVar24] = 0;
    iVar9 = (*aSyscall[4].pCurrent)(&local_448,&local_4d8);
    if (iVar9 != 0) {
      return 0x70a;
    }
    m = local_4c0 & 0x1ff;
    local_510 = local_4bc;
    local_50c = local_4b8;
  }
  uVar8 = robust_open(pcVar25,uVar22,m);
  if ((int)uVar8 < 0) {
    puVar11 = (uint *)__errno_location();
    if ((((flags & 0x12U) != 2) || (*puVar11 == 0x15)) ||
       (uVar8 = robust_open(pcVar25,uVar22 & 0x20080,m), (int)uVar8 < 0)) {
      iVar26 = 0xe;
      sqlite3_log(0xe,"cannot open file at line %d of [%.10s]",0x7061,
                  "118a3b35693b134d56ebd780123b7fd6f1497668");
      if (pcVar25 == (char *)0x0) {
        pcVar25 = "";
      }
      sqlite3_log(0xe,"os_unix.c:%d: (%d) %s(%s) - %s",0x7061,(ulong)*puVar11,"open",pcVar25,"");
      goto LAB_00149a13;
    }
    flags = (flags & 0xffffffe8U) + 1;
    uVar19 = 1;
  }
  if (uVar20 != 0) {
    (*aSyscall[0x14].pCurrent)((ulong)uVar8,(ulong)local_510,(ulong)local_50c);
  }
  goto LAB_00149796;
  while (*(int *)&psVar10->field_0x4 != flags) {
LAB_001496fc:
    psVar21 = psVar10;
    psVar10 = (sqlite3_io_methods *)psVar21->xClose;
    if (psVar10 == (sqlite3_io_methods *)0x0) goto LAB_0014971b;
  }
  ppUVar13 = (UnixUnusedFd **)&psVar21->xClose;
LAB_00149712:
  *ppUVar13 = (UnixUnusedFd *)psVar10->xClose;
LAB_0014971e:
  if ((sqlite3Config.bCoreMutex != 0) &&
     (psVar15 = (*sqlite3Config.mutex.xMutexAlloc)(2), psVar15 != (sqlite3_mutex *)0x0)) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar15);
  }
  if (psVar10 == (sqlite3_io_methods *)0x0) {
LAB_001493ed:
    iVar9 = sqlite3_initialize();
    if (iVar9 != 0) {
      return 7;
    }
    psVar10 = (sqlite3_io_methods *)sqlite3Malloc(0x10);
    if (psVar10 == (sqlite3_io_methods *)0x0) {
      return 7;
    }
    uVar8 = 0xffffffff;
  }
  else {
    uVar8 = psVar10->iVersion;
  }
  pFile[6].pMethods = psVar10;
  iVar9 = uVar22 * 0x10 + 0x20080;
  if ((flags & 0x10U) == 0) {
    iVar9 = uVar22 * 0x10;
  }
  bVar2 = true;
  bVar3 = false;
  bVar7 = true;
  if ((int)uVar8 < 0) goto LAB_00149492;
LAB_00149796:
  if (pOutFlags != (int *)0x0) {
    *pOutFlags = flags;
  }
  psVar10 = pFile[6].pMethods;
  if (psVar10 != (sqlite3_io_methods *)0x0) {
    psVar10->iVersion = uVar8;
    *(int *)&psVar10->field_0x4 = flags;
  }
  if (uVar18 != 0) {
    (*aSyscall[0x10].pCurrent)();
  }
  uVar22 = uVar18 * 4 + 2;
  if (uVar19 == 0) {
    uVar22 = uVar18 * 4;
  }
  uVar18 = uVar22 + 0x80;
  if (bVar2) {
    uVar18 = uVar22;
  }
  uVar19 = uVar18 | 8;
  if (!bVar3) {
    uVar19 = uVar18;
  }
  *(uint *)&pFile[3].pMethods = uVar8;
  pFile[1].pMethods = (sqlite3_io_methods *)pVfs;
  pFile[7].pMethods = (sqlite3_io_methods *)zPath;
  *(ushort *)((long)&pFile[3].pMethods + 6) = (ushort)(flags & 0x40U) | (ushort)uVar19;
  pFile[0xc].pMethods = (sqlite3_io_methods *)sqlite3Config.szMmap;
  pcVar25 = (char *)0x0;
  if ((flags & 0x40U) != 0 || (uVar19 & 0x40) != 0) {
    pcVar25 = zPath;
  }
  iVar9 = sqlite3_uri_boolean(pcVar25,"psow",1);
  if (iVar9 != 0) {
    pbVar1 = (byte *)((long)&pFile[3].pMethods + 6);
    *pbVar1 = *pbVar1 | 0x10;
  }
  iVar9 = strcmp(pVfs->zName,"unix-excl");
  if (iVar9 == 0) {
    pbVar1 = (byte *)((long)&pFile[3].pMethods + 6);
    *pbVar1 = *pbVar1 | 1;
  }
  if ((char)uVar19 < '\0') {
    psVar10 = &nolockIoMethods;
LAB_001498bb:
    *(undefined4 *)&pFile[4].pMethods = 0;
    goto LAB_001498c5;
  }
  psVar10 = (sqlite3_io_methods *)(**pVfs->pAppData)(zPath,pFile);
  psVar21 = &posixIoMethods;
  if (psVar10 == &posixIoMethods) {
    if ((sqlite3Config.bCoreMutex != 0) &&
       (psVar15 = (*sqlite3Config.mutex.xMutexAlloc)(2), psVar15 != (sqlite3_mutex *)0x0)) {
      (*sqlite3Config.mutex.xMutexEnter)(psVar15);
    }
    iVar9 = (*aSyscall[5].pCurrent)((ulong)*(uint *)&pFile[3].pMethods,&local_448);
    if (iVar9 == 0) {
      local_4d8 = local_448;
      dVar5 = local_4d8;
      uStack_4d0 = p_Stack_440;
      p_Var6 = uStack_4d0;
      for (psVar10 = (sqlite3_io_methods *)inodeList; local_4d8 = dVar5, uStack_4d0 = p_Var6,
          psVar10 != (sqlite3_io_methods *)0x0; psVar10 = (sqlite3_io_methods *)psVar10->xLock) {
        local_4d8._0_1_ = (char)local_448;
        local_4d8._1_1_ = (char)(local_448 >> 8);
        local_4d8._2_1_ = (char)(local_448 >> 0x10);
        local_4d8._3_1_ = (char)(local_448 >> 0x18);
        local_4d8._4_1_ = (char)(local_448 >> 0x20);
        local_4d8._5_1_ = (char)(local_448 >> 0x28);
        local_4d8._6_1_ = (char)(local_448 >> 0x30);
        local_4d8._7_1_ = (char)(local_448 >> 0x38);
        uStack_4d0._0_1_ = (char)p_Stack_440;
        uStack_4d0._1_1_ = (char)((ulong)p_Stack_440 >> 8);
        uStack_4d0._2_1_ = (char)((ulong)p_Stack_440 >> 0x10);
        uStack_4d0._3_1_ = (char)((ulong)p_Stack_440 >> 0x18);
        uStack_4d0._4_1_ = (char)((ulong)p_Stack_440 >> 0x20);
        uStack_4d0._5_1_ = (char)((ulong)p_Stack_440 >> 0x28);
        uStack_4d0._6_1_ = (char)((ulong)p_Stack_440 >> 0x30);
        uStack_4d0._7_1_ = (char)((ulong)p_Stack_440 >> 0x38);
        auVar27[0] = -((char)((unixFileId *)&psVar10->iVersion)->dev == (char)local_4d8);
        auVar27[1] = -(*(char *)((long)&((unixFileId *)&psVar10->iVersion)->dev + 1) ==
                      local_4d8._1_1_);
        auVar27[2] = -(*(char *)((long)&((unixFileId *)&psVar10->iVersion)->dev + 2) ==
                      local_4d8._2_1_);
        auVar27[3] = -(*(char *)((long)&((unixFileId *)&psVar10->iVersion)->dev + 3) ==
                      local_4d8._3_1_);
        auVar27[4] = -(psVar10->field_0x4 == local_4d8._4_1_);
        auVar27[5] = -(psVar10->field_0x5 == local_4d8._5_1_);
        auVar27[6] = -(psVar10->field_0x6 == local_4d8._6_1_);
        auVar27[7] = -(psVar10->field_0x7 == local_4d8._7_1_);
        auVar27[8] = -(*(char *)&psVar10->xClose == (char)uStack_4d0);
        auVar27[9] = -(*(char *)((long)&psVar10->xClose + 1) == uStack_4d0._1_1_);
        auVar27[10] = -(*(char *)((long)&psVar10->xClose + 2) == uStack_4d0._2_1_);
        auVar27[0xb] = -(*(char *)((long)&psVar10->xClose + 3) == uStack_4d0._3_1_);
        auVar27[0xc] = -(*(char *)((long)&psVar10->xClose + 4) == uStack_4d0._4_1_);
        auVar27[0xd] = -(*(char *)((long)&psVar10->xClose + 5) == uStack_4d0._5_1_);
        auVar27[0xe] = -(*(char *)((long)&psVar10->xClose + 6) == uStack_4d0._6_1_);
        auVar27[0xf] = -(*(char *)((long)&psVar10->xClose + 7) == uStack_4d0._7_1_);
        if ((ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar27[0xf] >> 7) << 0xf) == 0xffff) {
          *(int *)&psVar10->xWrite = *(int *)&psVar10->xWrite + 1;
          psVar17 = (sqlite3_io_methods *)inodeList;
          goto LAB_00149a8d;
        }
      }
      iVar9 = sqlite3_initialize();
      iVar26 = 7;
      if ((iVar9 != 0) ||
         (psVar10 = (sqlite3_io_methods *)sqlite3Malloc(0x48), psVar10 == (sqlite3_io_methods *)0x0)
         ) goto LAB_0014997b;
      *(undefined1 (*) [16])&psVar10->xTruncate = (undefined1  [16])0x0;
      psVar10->xRead = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)0x0;
      psVar10->xWrite = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)0x0;
      psVar10->xFileSize = (_func_int_sqlite3_file_ptr_sqlite3_int64_ptr *)0x0;
      *(dev_t *)psVar10 = local_4d8;
      psVar10->xClose = uStack_4d0;
      *(int *)&psVar10->xWrite = 1;
      psVar10->xLock = (_func_int_sqlite3_file_ptr_int *)inodeList;
      psVar10->xUnlock = (_func_int_sqlite3_file_ptr_int *)0x0;
      psVar17 = psVar10;
      if (inodeList != (unixInodeInfo *)0x0) {
        inodeList->pPrev = (unixInodeInfo *)psVar10;
      }
LAB_00149a8d:
      inodeList = (unixInodeInfo *)psVar17;
      pFile[2].pMethods = psVar10;
      iVar26 = 0;
    }
    else {
      piVar16 = __errno_location();
      iVar9 = *piVar16;
      *(int *)&pFile[4].pMethods = iVar9;
      iVar26 = 10;
      if (iVar9 == 0x4b) {
        iVar26 = 0x16;
      }
LAB_0014997b:
      robust_close((unixFile *)pFile,uVar8,0x6e90);
      uVar8 = 0xffffffff;
    }
    if ((sqlite3Config.bCoreMutex != 0) &&
       (psVar15 = (*sqlite3Config.mutex.xMutexAlloc)(2), psVar15 != (sqlite3_mutex *)0x0)) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar15);
    }
  }
  else {
    psVar21 = &dotlockIoMethods;
    if (psVar10 != &dotlockIoMethods) goto LAB_001498bb;
    sVar14 = strlen(zPath);
    iVar9 = sqlite3_initialize();
    iVar26 = 7;
    if (iVar9 == 0) {
      iVar9 = (int)sVar14 + 6;
      psVar17 = (sqlite3_io_methods *)sqlite3Malloc(iVar9);
      psVar10 = (sqlite3_io_methods *)0x0;
      if (psVar17 != (sqlite3_io_methods *)0x0) {
        sqlite3_snprintf(iVar9,(char *)psVar17,"%s.lock",zPath);
        iVar26 = 0;
        psVar10 = psVar17;
      }
    }
    else {
      psVar10 = (sqlite3_io_methods *)0x0;
    }
    pFile[5].pMethods = psVar10;
  }
  *(undefined4 *)&pFile[4].pMethods = 0;
  psVar10 = psVar21;
  if (iVar26 != 0) {
    if (-1 < (int)uVar8) {
      robust_close((unixFile *)pFile,uVar8,0x6ee5);
    }
LAB_00149a13:
    sqlite3_free(pFile[6].pMethods);
    return iVar26;
  }
LAB_001498c5:
  pFile->pMethods = psVar10;
  verifyDbFile((unixFile *)pFile);
  return 0;
}

Assistant:

static int unixOpen(
  sqlite3_vfs *pVfs,           /* The VFS for which this is the xOpen method */
  const char *zPath,           /* Pathname of file to be opened */
  sqlite3_file *pFile,         /* The file descriptor to be filled in */
  int flags,                   /* Input flags to control the opening */
  int *pOutFlags               /* Output flags returned to SQLite core */
){
  unixFile *p = (unixFile *)pFile;
  int fd = -1;                   /* File descriptor returned by open() */
  int openFlags = 0;             /* Flags to pass to open() */
  int eType = flags&0xFFFFFF00;  /* Type of file to open */
  int noLock;                    /* True to omit locking primitives */
  int rc = SQLITE_OK;            /* Function Return Code */
  int ctrlFlags = 0;             /* UNIXFILE_* flags */

  int isExclusive  = (flags & SQLITE_OPEN_EXCLUSIVE);
  int isDelete     = (flags & SQLITE_OPEN_DELETEONCLOSE);
  int isCreate     = (flags & SQLITE_OPEN_CREATE);
  int isReadonly   = (flags & SQLITE_OPEN_READONLY);
  int isReadWrite  = (flags & SQLITE_OPEN_READWRITE);
#if SQLITE_ENABLE_LOCKING_STYLE
  int isAutoProxy  = (flags & SQLITE_OPEN_AUTOPROXY);
#endif
#if defined(__APPLE__) || SQLITE_ENABLE_LOCKING_STYLE
  struct statfs fsInfo;
#endif

  /* If creating a master or main-file journal, this function will open
  ** a file-descriptor on the directory too. The first time unixSync()
  ** is called the directory file descriptor will be fsync()ed and close()d.
  */
  int syncDir = (isCreate && (
        eType==SQLITE_OPEN_MASTER_JOURNAL 
     || eType==SQLITE_OPEN_MAIN_JOURNAL 
     || eType==SQLITE_OPEN_WAL
  ));

  /* If argument zPath is a NULL pointer, this function is required to open
  ** a temporary file. Use this buffer to store the file name in.
  */
  char zTmpname[MAX_PATHNAME+2];
  const char *zName = zPath;

  /* Check the following statements are true: 
  **
  **   (a) Exactly one of the READWRITE and READONLY flags must be set, and 
  **   (b) if CREATE is set, then READWRITE must also be set, and
  **   (c) if EXCLUSIVE is set, then CREATE must also be set.
  **   (d) if DELETEONCLOSE is set, then CREATE must also be set.
  */
  assert((isReadonly==0 || isReadWrite==0) && (isReadWrite || isReadonly));
  assert(isCreate==0 || isReadWrite);
  assert(isExclusive==0 || isCreate);
  assert(isDelete==0 || isCreate);

  /* The main DB, main journal, WAL file and master journal are never 
  ** automatically deleted. Nor are they ever temporary files.  */
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_MAIN_DB );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_MAIN_JOURNAL );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_MASTER_JOURNAL );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_WAL );

  /* Assert that the upper layer has set one of the "file-type" flags. */
  assert( eType==SQLITE_OPEN_MAIN_DB      || eType==SQLITE_OPEN_TEMP_DB 
       || eType==SQLITE_OPEN_MAIN_JOURNAL || eType==SQLITE_OPEN_TEMP_JOURNAL 
       || eType==SQLITE_OPEN_SUBJOURNAL   || eType==SQLITE_OPEN_MASTER_JOURNAL 
       || eType==SQLITE_OPEN_TRANSIENT_DB || eType==SQLITE_OPEN_WAL
  );

  memset(p, 0, sizeof(unixFile));

  if( eType==SQLITE_OPEN_MAIN_DB ){
    UnixUnusedFd *pUnused;
    pUnused = findReusableFd(zName, flags);
    if( pUnused ){
      fd = pUnused->fd;
    }else{
      pUnused = sqlite3_malloc(sizeof(*pUnused));
      if( !pUnused ){
        return SQLITE_NOMEM;
      }
    }
    p->pUnused = pUnused;

    /* Database filenames are double-zero terminated if they are not
    ** URIs with parameters.  Hence, they can always be passed into
    ** sqlite3_uri_parameter(). */
    assert( (flags & SQLITE_OPEN_URI) || zName[strlen(zName)+1]==0 );

  }else if( !zName ){
    /* If zName is NULL, the upper layer is requesting a temp file. */
    assert(isDelete && !syncDir);
    rc = unixGetTempname(MAX_PATHNAME+2, zTmpname);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    zName = zTmpname;

    /* Generated temporary filenames are always double-zero terminated
    ** for use by sqlite3_uri_parameter(). */
    assert( zName[strlen(zName)+1]==0 );
  }

  /* Determine the value of the flags parameter passed to POSIX function
  ** open(). These must be calculated even if open() is not called, as
  ** they may be stored as part of the file handle and used by the 
  ** 'conch file' locking functions later on.  */
  if( isReadonly )  openFlags |= O_RDONLY;
  if( isReadWrite ) openFlags |= O_RDWR;
  if( isCreate )    openFlags |= O_CREAT;
  if( isExclusive ) openFlags |= (O_EXCL|O_NOFOLLOW);
  openFlags |= (O_LARGEFILE|O_BINARY);

  if( fd<0 ){
    mode_t openMode;              /* Permissions to create file with */
    uid_t uid;                    /* Userid for the file */
    gid_t gid;                    /* Groupid for the file */
    rc = findCreateFileMode(zName, flags, &openMode, &uid, &gid);
    if( rc!=SQLITE_OK ){
      assert( !p->pUnused );
      assert( eType==SQLITE_OPEN_WAL || eType==SQLITE_OPEN_MAIN_JOURNAL );
      return rc;
    }
    fd = robust_open(zName, openFlags, openMode);
    OSTRACE(("OPENX   %-3d %s 0%o\n", fd, zName, openFlags));
    if( fd<0 && errno!=EISDIR && isReadWrite && !isExclusive ){
      /* Failed to open the file for read/write access. Try read-only. */
      flags &= ~(SQLITE_OPEN_READWRITE|SQLITE_OPEN_CREATE);
      openFlags &= ~(O_RDWR|O_CREAT);
      flags |= SQLITE_OPEN_READONLY;
      openFlags |= O_RDONLY;
      isReadonly = 1;
      fd = robust_open(zName, openFlags, openMode);
    }
    if( fd<0 ){
      rc = unixLogError(SQLITE_CANTOPEN_BKPT, "open", zName);
      goto open_finished;
    }

    /* If this process is running as root and if creating a new rollback
    ** journal or WAL file, set the ownership of the journal or WAL to be
    ** the same as the original database.
    */
    if( flags & (SQLITE_OPEN_WAL|SQLITE_OPEN_MAIN_JOURNAL) ){
      osFchown(fd, uid, gid);
    }
  }
  assert( fd>=0 );
  if( pOutFlags ){
    *pOutFlags = flags;
  }

  if( p->pUnused ){
    p->pUnused->fd = fd;
    p->pUnused->flags = flags;
  }

  if( isDelete ){
#if OS_VXWORKS
    zPath = zName;
#else
    osUnlink(zName);
#endif
  }
#if SQLITE_ENABLE_LOCKING_STYLE
  else{
    p->openFlags = openFlags;
  }
#endif

  noLock = eType!=SQLITE_OPEN_MAIN_DB;

  
#if defined(__APPLE__) || SQLITE_ENABLE_LOCKING_STYLE
  if( fstatfs(fd, &fsInfo) == -1 ){
    ((unixFile*)pFile)->lastErrno = errno;
    robust_close(p, fd, __LINE__);
    return SQLITE_IOERR_ACCESS;
  }
  if (0 == strncmp("msdos", fsInfo.f_fstypename, 5)) {
    ((unixFile*)pFile)->fsFlags |= SQLITE_FSFLAGS_IS_MSDOS;
  }
#endif

  /* Set up appropriate ctrlFlags */
  if( isDelete )                ctrlFlags |= UNIXFILE_DELETE;
  if( isReadonly )              ctrlFlags |= UNIXFILE_RDONLY;
  if( noLock )                  ctrlFlags |= UNIXFILE_NOLOCK;
  if( syncDir )                 ctrlFlags |= UNIXFILE_DIRSYNC;
  if( flags & SQLITE_OPEN_URI ) ctrlFlags |= UNIXFILE_URI;

#if SQLITE_ENABLE_LOCKING_STYLE
#if SQLITE_PREFER_PROXY_LOCKING
  isAutoProxy = 1;
#endif
  if( isAutoProxy && (zPath!=NULL) && (!noLock) && pVfs->xOpen ){
    char *envforce = getenv("SQLITE_FORCE_PROXY_LOCKING");
    int useProxy = 0;

    /* SQLITE_FORCE_PROXY_LOCKING==1 means force always use proxy, 0 means 
    ** never use proxy, NULL means use proxy for non-local files only.  */
    if( envforce!=NULL ){
      useProxy = atoi(envforce)>0;
    }else{
      if( statfs(zPath, &fsInfo) == -1 ){
        /* In theory, the close(fd) call is sub-optimal. If the file opened
        ** with fd is a database file, and there are other connections open
        ** on that file that are currently holding advisory locks on it,
        ** then the call to close() will cancel those locks. In practice,
        ** we're assuming that statfs() doesn't fail very often. At least
        ** not while other file descriptors opened by the same process on
        ** the same file are working.  */
        p->lastErrno = errno;
        robust_close(p, fd, __LINE__);
        rc = SQLITE_IOERR_ACCESS;
        goto open_finished;
      }
      useProxy = !(fsInfo.f_flags&MNT_LOCAL);
    }
    if( useProxy ){
      rc = fillInUnixFile(pVfs, fd, pFile, zPath, ctrlFlags);
      if( rc==SQLITE_OK ){
        rc = proxyTransformUnixFile((unixFile*)pFile, ":auto:");
        if( rc!=SQLITE_OK ){
          /* Use unixClose to clean up the resources added in fillInUnixFile 
          ** and clear all the structure's references.  Specifically, 
          ** pFile->pMethods will be NULL so sqlite3OsClose will be a no-op 
          */
          unixClose(pFile);
          return rc;
        }
      }
      goto open_finished;
    }
  }
#endif
  
  rc = fillInUnixFile(pVfs, fd, pFile, zPath, ctrlFlags);

open_finished:
  if( rc!=SQLITE_OK ){
    sqlite3_free(p->pUnused);
  }
  return rc;
}